

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

int SUNMatZero_Sparse(SUNMatrix A)

{
  sunindextype i;
  SUNMatrix A_local;
  
  for (i = 0; i < *(int *)((long)A->content + 8); i = i + 1) {
    *(undefined8 *)(*(long *)((long)A->content + 0x10) + (long)i * 8) = 0;
    *(undefined4 *)(*(long *)((long)A->content + 0x20) + (long)i * 4) = 0;
  }
  for (i = 0; i < *(int *)((long)A->content + 0xc); i = i + 1) {
    *(undefined4 *)(*(long *)((long)A->content + 0x28) + (long)i * 4) = 0;
  }
  *(undefined4 *)(*(long *)((long)A->content + 0x28) + (long)*(int *)((long)A->content + 0xc) * 4) =
       0;
  return 0;
}

Assistant:

int SUNMatZero_Sparse(SUNMatrix A)
{
  sunindextype i;

  /* Perform operation */
  for (i=0; i<SM_NNZ_S(A); i++) {
    (SM_DATA_S(A))[i] = ZERO;
    (SM_INDEXVALS_S(A))[i] = 0;
  }
  for (i=0; i<SM_NP_S(A); i++)
    (SM_INDEXPTRS_S(A))[i] = 0;
  (SM_INDEXPTRS_S(A))[SM_NP_S(A)] = 0;
  return SUNMAT_SUCCESS;
}